

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O3

int __thiscall QTcpServer::listen(QTcpServer *this,int __fd,int __n)

{
  QHostAddress *address;
  QHostAddressPrivate *pQVar1;
  QHostAddressPrivate *pQVar2;
  char cVar3;
  quint16 qVar4;
  NetworkLayerProtocol NVar5;
  NetworkLayerProtocol NVar6;
  SocketError SVar7;
  QHostAddressPrivate *pQVar8;
  int iVar9;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QNetworkProxy proxy;
  QHostAddress addr;
  QString local_68;
  undefined1 local_48 [8];
  QHostAddress local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  address = *(QHostAddress **)&this->field_0x8;
  if (*(int *)((long)&address[0x15].d.d.ptr + 4) == 5) {
    listen((int)this,__fd);
    iVar9 = 0;
    goto LAB_001c6e66;
  }
  NVar5 = QHostAddress::protocol((QHostAddress *)CONCAT44(in_register_00000034,__fd));
  local_40.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&local_40,(QHostAddress *)CONCAT44(in_register_00000034,__fd));
  local_48 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QTcpServerPrivate::resolveProxy((QTcpServerPrivate *)local_48,address,(quint16)&local_40);
  pQVar8 = address[0x16].d.d.ptr;
  if (pQVar8 != (QHostAddressPrivate *)0x0) {
    (**(code **)(*(long *)pQVar8 + 0x20))();
  }
  pQVar8 = (QHostAddressPrivate *)
           QAbstractSocketEngine::createSocketEngine
                     (*(SocketType *)&address[0x15].d.d.ptr,(QNetworkProxy *)local_48,
                      &this->super_QObject);
  address[0x16].d.d.ptr = pQVar8;
  if (pQVar8 == (QHostAddressPrivate *)0x0) {
    *(undefined4 *)&address[0x17].d.d.ptr = 10;
    QMetaObject::tr((char *)&local_68,(char *)&staticMetaObject,0x25fdfb);
LAB_001c6dfc:
    pQVar8 = address[0x18].d.d.ptr;
    pQVar1 = address[0x19].d.d.ptr;
    address[0x18].d.d.ptr = (QHostAddressPrivate *)local_68.d.d;
    address[0x19].d.d.ptr = (QHostAddressPrivate *)local_68.d.ptr;
    pQVar2 = address[0x1a].d.d.ptr;
    address[0x1a].d.d.ptr = (QHostAddressPrivate *)local_68.d.size;
    local_68.d.d = (Data *)pQVar8;
    local_68.d.ptr = (char16_t *)pQVar1;
    local_68.d.size = (qsizetype)pQVar2;
    if (pQVar8 != (QHostAddressPrivate *)0x0) {
      LOCK();
      (pQVar8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value = (Type)((int)(pQVar8->super_QSharedData).ref.super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + -1);
      UNLOCK();
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value == (__atomic_base<int>)0x0) {
        QArrayData::deallocate((QArrayData *)pQVar8,2,0x10);
      }
    }
    iVar9 = 0;
  }
  else {
    cVar3 = (**(code **)(*(long *)pQVar8 + 0x60))
                      (pQVar8,*(undefined4 *)&address[0x15].d.d.ptr,NVar5);
    pQVar8 = address[0x16].d.d.ptr;
    if (cVar3 == '\0') {
LAB_001c6dae:
      SVar7 = QAbstractSocketEngine::error((QAbstractSocketEngine *)pQVar8);
      *(SocketError *)&address[0x17].d.d.ptr = SVar7;
      QAbstractSocketEngine::errorString(&local_68,(QAbstractSocketEngine *)address[0x16].d.d.ptr);
      goto LAB_001c6dfc;
    }
    NVar6 = QAbstractSocketEngine::protocol((QAbstractSocketEngine *)pQVar8);
    NVar5 = QHostAddress::protocol(&local_40);
    if (NVar5 == AnyIPProtocol && NVar6 == IPv4Protocol) {
      QHostAddress::operator=(&local_40,AnyIPv4);
    }
    (*(code *)(((address->d).d.ptr)->field_1).a6_64.c[0])(address);
    pQVar8 = address[0x16].d.d.ptr;
    cVar3 = (**(code **)(*(long *)pQVar8 + 0x90))(pQVar8,&local_40,__n & 0xffff);
    pQVar8 = address[0x16].d.d.ptr;
    if (cVar3 == '\0') goto LAB_001c6dae;
    cVar3 = (**(code **)(*(long *)pQVar8 + 0x98))(pQVar8,*(undefined4 *)&address[0x1b].d.d.ptr);
    pQVar8 = address[0x16].d.d.ptr;
    if (cVar3 == '\0') goto LAB_001c6dae;
    QAbstractSocketEngine::setReceiver
              ((QAbstractSocketEngine *)pQVar8,(QAbstractSocketEngineReceiver *)(address + 0xf));
    pQVar8 = address[0x16].d.d.ptr;
    (**(code **)(*(long *)pQVar8 + 0x140))(pQVar8,1);
    *(undefined4 *)((long)&address[0x15].d.d.ptr + 4) = 5;
    QAbstractSocketEngine::localAddress((QAbstractSocketEngine *)&local_68);
    pQVar8 = address[0x14].d.d.ptr;
    address[0x14].d.d.ptr = (QHostAddressPrivate *)local_68.d.d;
    local_68.d.d = (Data *)pQVar8;
    QHostAddress::~QHostAddress((QHostAddress *)&local_68);
    qVar4 = QAbstractSocketEngine::localPort((QAbstractSocketEngine *)address[0x16].d.d.ptr);
    *(quint16 *)&address[0x13].d.d.ptr = qVar4;
    iVar9 = (int)CONCAT71((int7)((ulong)address >> 8),1);
  }
  QNetworkProxy::~QNetworkProxy((QNetworkProxy *)local_48);
  QHostAddress::~QHostAddress(&local_40);
LAB_001c6e66:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar9;
  }
  __stack_chk_fail();
}

Assistant:

bool QTcpServer::listen(const QHostAddress &address, quint16 port)
{
    Q_D(QTcpServer);
    if (d->state == QAbstractSocket::ListeningState) {
        qWarning("QTcpServer::listen() called when already listening");
        return false;
    }

    QAbstractSocket::NetworkLayerProtocol proto = address.protocol();
    QHostAddress addr = address;

#ifdef QT_NO_NETWORKPROXY
    static const QNetworkProxy &proxy = *(QNetworkProxy *)0;
#else
    QNetworkProxy proxy = d->resolveProxy(addr, port);
#endif

    delete d->socketEngine;
    d->socketEngine = QAbstractSocketEngine::createSocketEngine(d->socketType, proxy, this);
    if (!d->socketEngine) {
        d->serverSocketError = QAbstractSocket::UnsupportedSocketOperationError;
        d->serverSocketErrorString = tr("Operation on socket is not supported");
        return false;
    }
    if (!d->socketEngine->initialize(d->socketType, proto)) {
        d->serverSocketError = d->socketEngine->error();
        d->serverSocketErrorString = d->socketEngine->errorString();
        return false;
    }
    proto = d->socketEngine->protocol();
    if (addr.protocol() == QAbstractSocket::AnyIPProtocol && proto == QAbstractSocket::IPv4Protocol)
        addr = QHostAddress::AnyIPv4;

    d->configureCreatedSocket();

    if (!d->socketEngine->bind(addr, port)) {
        d->serverSocketError = d->socketEngine->error();
        d->serverSocketErrorString = d->socketEngine->errorString();
        return false;
    }

    if (!d->socketEngine->listen(d->listenBacklog)) {
        d->serverSocketError = d->socketEngine->error();
        d->serverSocketErrorString = d->socketEngine->errorString();
        return false;
    }

    d->socketEngine->setReceiver(d);
    d->socketEngine->setReadNotificationEnabled(true);

    d->state = QAbstractSocket::ListeningState;
    d->address = d->socketEngine->localAddress();
    d->port = d->socketEngine->localPort();

#if defined (QTCPSERVER_DEBUG)
    qDebug("QTcpServer::listen(%i, \"%s\") == true (listening on port %i)", port,
           address.toString().toLatin1().constData(), d->socketEngine->localPort());
#endif
    return true;
}